

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O1

optional<int> obj::read_index(char **ptr)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  _Optional_payload_base<int> _Var4;
  char *pcVar5;
  char *pcVar6;
  char *base;
  char *local_28;
  
  local_28 = *ptr;
  pcVar5 = local_28 + -1;
  do {
    cVar1 = pcVar5[1];
    pcVar5 = pcVar5 + 1;
    iVar2 = isspace((int)cVar1);
  } while (iVar2 != 0);
  if (cVar1 == '-' || (int)cVar1 - 0x30U < 10) {
    local_28 = pcVar5;
    uVar3 = strtol(pcVar5,&local_28,10);
    pcVar5 = local_28;
    do {
      pcVar6 = pcVar5;
      cVar1 = *pcVar6;
      iVar2 = isspace((int)cVar1);
      pcVar5 = pcVar6 + 1;
    } while (iVar2 != 0);
    local_28 = pcVar6;
    if (cVar1 == '/') {
      local_28 = pcVar5;
      if (*pcVar5 != '/') {
        strtol(pcVar5,&local_28,10);
        pcVar5 = local_28;
      }
      do {
        pcVar6 = pcVar5;
        cVar1 = *pcVar6;
        iVar2 = isspace((int)cVar1);
        pcVar5 = pcVar6 + 1;
      } while (iVar2 != 0);
      local_28 = pcVar6;
      if (cVar1 == '/') {
        local_28 = pcVar5;
        strtol(pcVar5,&local_28,10);
      }
    }
    *ptr = local_28;
    _Var4 = (_Optional_payload_base<int>)(uVar3 & 0xffffffff | 0x100000000);
  }
  else {
    _Var4._M_payload = (_Storage<int,_true>)0x0;
    _Var4._M_engaged = false;
    _Var4._5_3_ = 0;
  }
  return (optional<int>)_Var4;
}

Assistant:

inline std::optional<int> read_index(char** ptr) {
    char* base = *ptr;

    // Detect end of line (negative indices are supported) 
    base = strip_spaces(base);
    if (!std::isdigit(*base) && *base != '-')
        return std::nullopt;

    int index = std::strtol(base, &base, 10);
    base = strip_spaces(base);

    if (*base == '/') {
        base++;

        // Handle the case when there is no texture coordinate
        if (*base != '/')
            std::strtol(base, &base, 10);

        base = strip_spaces(base);

        if (*base == '/') {
            base++;
            std::strtol(base, &base, 10);
        }
    }

    *ptr = base;
    return std::make_optional(index);
}